

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  uint64 *puVar1;
  vector<unsigned_char> *this_00;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  uchar *puVar7;
  char cVar8;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [14];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [14];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint3 uVar42;
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [11];
  undefined1 auVar62 [15];
  unkuint9 Var63;
  undefined1 auVar64 [11];
  undefined1 auVar65 [13];
  undefined1 auVar66 [14];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [13];
  undefined1 auVar70 [14];
  undefined1 auVar71 [15];
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [14];
  undefined1 auVar75 [11];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  uint3 uVar78;
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  uint6 uVar84;
  uint6 uVar85;
  uint6 uVar86;
  potential_solution *ppVar87;
  ulong uVar88;
  uint uVar89;
  ulong uVar90;
  int iVar91;
  uint uVar92;
  uint uVar93;
  int iVar94;
  uint uVar95;
  ulong uVar96;
  int result;
  uint uVar97;
  int iVar98;
  int inten_table;
  long lVar99;
  ulong __n;
  bool bVar100;
  ushort uVar101;
  ushort uVar104;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ushort uVar105;
  undefined4 uVar106;
  undefined1 auVar107 [16];
  ushort uVar108;
  uint uVar109;
  int iVar113;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  uint uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  short sVar121;
  undefined1 auVar125 [12];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar126 [12];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  color_quad_u8 block_colors [4];
  uint block_inten_midpoints [3];
  byte local_a8 [14];
  byte bStack_9a;
  char cStack_99;
  uint64 *local_90;
  uint local_84 [4];
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  etc1_solution_coordinates *local_40;
  potential_solution *local_38;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  undefined6 uVar122;
  undefined8 uVar123;
  undefined1 auVar124 [12];
  undefined1 auVar127 [14];
  undefined1 auVar128 [14];
  undefined1 auVar129 [14];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  
  ppVar5 = this->m_pParams;
  bVar2 = (coords->m_unscaled_color).field_0.field_0.r;
  uVar97 = (uint)bVar2;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar98 = uVar97 - (ppVar5->m_base_color5).field_0.field_0.r;
    iVar91 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar94 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar113 = iVar91;
    if (iVar98 < iVar91) {
      iVar113 = iVar98;
    }
    if (iVar94 <= iVar113) {
      iVar113 = iVar94;
    }
    if (-5 < iVar113) {
      if (iVar91 < iVar98) {
        iVar91 = iVar98;
      }
      if (iVar91 <= iVar94) {
        iVar91 = iVar94;
      }
      if (iVar91 < 4) goto LAB_0018ef71;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_0018ef71:
    if (coords->m_color4 == true) {
      uVar97 = uVar97 << 4 | uVar97;
      uVar92 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
      uVar92 = uVar92 << 4 | uVar92;
      uVar95 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
      uVar95 = uVar95 << 4 | uVar95;
    }
    else {
      uVar97 = uVar97 << 3 | (uint)(bVar2 >> 2);
      bVar2 = (coords->m_unscaled_color).field_0.field_0.g;
      uVar92 = (uint)bVar2 << 3 | (uint)(bVar2 >> 2);
      bVar2 = (coords->m_unscaled_color).field_0.field_0.b;
      uVar95 = (uint)bVar2 << 3 | (uint)(bVar2 >> 2);
    }
    if (0xfe < uVar97) {
      uVar97 = 0xff;
    }
    if (0xfe < uVar92) {
      uVar92 = 0xff;
    }
    uVar89 = 0xff;
    if (uVar95 < 0xff) {
      uVar89 = uVar95;
    }
    uVar95 = ppVar5->m_num_src_pixels;
    __n = (ulong)uVar95;
    local_90 = &trial_solution->m_error;
    trial_solution->m_error = 0xffffffffffffffff;
    lVar99 = 7;
    uVar88 = 0xffffffffffffffff;
    auVar147 = _DAT_001a7020;
    auVar148 = _DAT_001ae030;
    uVar138 = uVar97;
    uVar139 = uVar97;
    uVar140 = uVar97;
    uVar141 = uVar92;
    uVar142 = uVar92;
    uVar143 = uVar92;
    uVar144 = uVar89;
    uVar145 = uVar89;
    uVar146 = uVar89;
    local_84[3] = uVar89;
    uStack_74 = uVar89;
    uStack_70 = uVar89;
    uStack_6c = uVar89;
    local_68 = uVar92;
    uStack_64 = uVar92;
    uStack_60 = uVar92;
    uStack_5c = uVar92;
    local_58 = uVar97;
    uStack_54 = uVar97;
    uStack_50 = uVar97;
    uStack_4c = uVar97;
    local_40 = coords;
    local_38 = pBest_solution;
    do {
      iVar113 = (&g_etc1_inten_tables)[lVar99 * 4];
      iVar91 = (&DAT_001b0c34)[lVar99 * 4];
      iVar94 = *(int *)(&DAT_001b0c38 + lVar99 * 0x10);
      iVar98 = *(int *)(&DAT_001b0c3c + lVar99 * 0x10);
      auVar136._0_4_ = iVar113 + uVar97;
      auVar136._4_4_ = iVar91 + uVar138;
      auVar136._8_4_ = iVar94 + uVar139;
      auVar136._12_4_ = iVar98 + uVar140;
      auVar110._0_4_ = iVar113 + uVar92;
      auVar110._4_4_ = iVar91 + uVar141;
      auVar110._8_4_ = iVar94 + uVar142;
      auVar110._12_4_ = iVar98 + uVar143;
      auVar115._0_4_ = iVar113 + uVar89;
      auVar115._4_4_ = iVar91 + uVar144;
      auVar115._8_4_ = iVar94 + uVar145;
      auVar115._12_4_ = iVar98 + uVar146;
      auVar118._0_4_ = -(uint)(auVar136._0_4_ < 0);
      auVar118._4_4_ = -(uint)(auVar136._4_4_ < 0);
      auVar118._8_4_ = -(uint)(auVar136._8_4_ < 0);
      auVar118._12_4_ = -(uint)(auVar136._12_4_ < 0);
      auVar102 = packssdw(auVar118,auVar118);
      auVar102 = packsswb(auVar102,auVar102);
      auVar118 = auVar136 ^ auVar147;
      auVar130._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
      auVar130._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
      auVar130._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
      auVar130._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
      auVar118 = ~auVar130 & auVar148 | auVar136 & auVar130;
      sVar16 = auVar118._0_2_;
      cVar8 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      sVar17 = auVar118._2_2_;
      sVar121 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),cVar8);
      sVar18 = auVar118._4_2_;
      cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      sVar19 = auVar118._6_2_;
      uVar106 = CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19),
                         CONCAT12(cVar9,sVar121));
      sVar20 = auVar118._8_2_;
      cVar10 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      sVar21 = auVar118._10_2_;
      uVar122 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21),
                         CONCAT14(cVar10,uVar106));
      sVar22 = auVar118._12_2_;
      cVar11 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      sVar23 = auVar118._14_2_;
      uVar123 = CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23),
                         CONCAT16(cVar11,uVar122));
      cVar12 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      auVar124._0_10_ =
           CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),
                    CONCAT18(cVar12,uVar123));
      cVar13 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      auVar124[10] = cVar13;
      auVar124[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19);
      cVar14 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      auVar127[0xc] = cVar14;
      auVar127._0_12_ = auVar124;
      auVar127[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21);
      cVar15 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      auVar131[0xe] = cVar15;
      auVar131._0_14_ = auVar127;
      auVar131[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23);
      sVar16 = (short)((uint)uVar106 >> 0x10);
      auVar103[1] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
      auVar103[0] = (0 < sVar121) * (sVar121 < 0x100) * cVar8 - (0xff < sVar121);
      sVar17 = (short)((uint6)uVar122 >> 0x20);
      auVar103[2] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
      sVar18 = (short)((ulong)uVar123 >> 0x30);
      auVar103[3] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
      sVar19 = (short)((unkuint10)auVar124._0_10_ >> 0x40);
      auVar103[4] = (0 < sVar19) * (sVar19 < 0x100) * cVar12 - (0xff < sVar19);
      sVar20 = auVar124._10_2_;
      auVar103[5] = (0 < sVar20) * (sVar20 < 0x100) * cVar13 - (0xff < sVar20);
      sVar21 = auVar127._12_2_;
      auVar103[6] = (0 < sVar21) * (sVar21 < 0x100) * cVar14 - (0xff < sVar21);
      sVar22 = auVar131._14_2_;
      auVar103[7] = (0 < sVar22) * (sVar22 < 0x100) * cVar15 - (0xff < sVar22);
      auVar103[8] = (0 < sVar121) * (sVar121 < 0x100) * cVar8 - (0xff < sVar121);
      auVar103[9] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
      auVar103[10] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
      auVar103[0xb] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
      auVar103[0xc] = (0 < sVar19) * (sVar19 < 0x100) * cVar12 - (0xff < sVar19);
      auVar103[0xd] = (0 < sVar20) * (sVar20 < 0x100) * cVar13 - (0xff < sVar20);
      auVar103[0xe] = (0 < sVar21) * (sVar21 < 0x100) * cVar14 - (0xff < sVar21);
      auVar103[0xf] = (0 < sVar22) * (sVar22 < 0x100) * cVar15 - (0xff < sVar22);
      auVar103 = ~auVar102 & auVar103;
      auVar137._0_4_ = -(uint)(auVar110._0_4_ < 0);
      auVar137._4_4_ = -(uint)(auVar110._4_4_ < 0);
      auVar137._8_4_ = -(uint)(auVar110._8_4_ < 0);
      auVar137._12_4_ = -(uint)(auVar110._12_4_ < 0);
      auVar102 = packssdw(auVar137,auVar137);
      auVar102 = packsswb(auVar102,auVar102);
      auVar118 = auVar110 ^ auVar147;
      auVar132._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
      auVar132._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
      auVar132._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
      auVar132._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
      auVar118 = ~auVar132 & auVar148 | auVar110 & auVar132;
      sVar16 = auVar118._0_2_;
      cVar8 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      sVar17 = auVar118._2_2_;
      sVar121 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),cVar8);
      sVar18 = auVar118._4_2_;
      cVar15 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      sVar19 = auVar118._6_2_;
      uVar106 = CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19),
                         CONCAT12(cVar15,sVar121));
      sVar20 = auVar118._8_2_;
      cVar14 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      sVar21 = auVar118._10_2_;
      uVar122 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21),
                         CONCAT14(cVar14,uVar106));
      sVar22 = auVar118._12_2_;
      cVar13 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      sVar23 = auVar118._14_2_;
      uVar123 = CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23),
                         CONCAT16(cVar13,uVar122));
      cVar9 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      auVar125._0_10_ =
           CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),
                    CONCAT18(cVar9,uVar123));
      cVar12 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      auVar125[10] = cVar12;
      auVar125[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19);
      cVar11 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      auVar128[0xc] = cVar11;
      auVar128._0_12_ = auVar125;
      auVar128[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21);
      cVar10 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      auVar133[0xe] = cVar10;
      auVar133._0_14_ = auVar128;
      auVar133[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23);
      sVar16 = (short)((uint)uVar106 >> 0x10);
      auVar107[1] = (0 < sVar16) * (sVar16 < 0x100) * cVar15 - (0xff < sVar16);
      auVar107[0] = (0 < sVar121) * (sVar121 < 0x100) * cVar8 - (0xff < sVar121);
      sVar17 = (short)((uint6)uVar122 >> 0x20);
      auVar107[2] = (0 < sVar17) * (sVar17 < 0x100) * cVar14 - (0xff < sVar17);
      sVar18 = (short)((ulong)uVar123 >> 0x30);
      auVar107[3] = (0 < sVar18) * (sVar18 < 0x100) * cVar13 - (0xff < sVar18);
      sVar19 = (short)((unkuint10)auVar125._0_10_ >> 0x40);
      auVar107[4] = (0 < sVar19) * (sVar19 < 0x100) * cVar9 - (0xff < sVar19);
      sVar20 = auVar125._10_2_;
      auVar107[5] = (0 < sVar20) * (sVar20 < 0x100) * cVar12 - (0xff < sVar20);
      sVar21 = auVar128._12_2_;
      auVar107[6] = (0 < sVar21) * (sVar21 < 0x100) * cVar11 - (0xff < sVar21);
      sVar22 = auVar133._14_2_;
      auVar107[7] = (0 < sVar22) * (sVar22 < 0x100) * cVar10 - (0xff < sVar22);
      auVar107[8] = (0 < sVar121) * (sVar121 < 0x100) * cVar8 - (0xff < sVar121);
      auVar107[9] = (0 < sVar16) * (sVar16 < 0x100) * cVar15 - (0xff < sVar16);
      auVar107[10] = (0 < sVar17) * (sVar17 < 0x100) * cVar14 - (0xff < sVar17);
      auVar107[0xb] = (0 < sVar18) * (sVar18 < 0x100) * cVar13 - (0xff < sVar18);
      auVar107[0xc] = (0 < sVar19) * (sVar19 < 0x100) * cVar9 - (0xff < sVar19);
      auVar107[0xd] = (0 < sVar20) * (sVar20 < 0x100) * cVar12 - (0xff < sVar20);
      auVar107[0xe] = (0 < sVar21) * (sVar21 < 0x100) * cVar11 - (0xff < sVar21);
      auVar107[0xf] = (0 < sVar22) * (sVar22 < 0x100) * cVar10 - (0xff < sVar22);
      auVar107 = ~auVar102 & auVar107;
      auVar111._0_4_ = -(uint)(auVar115._0_4_ < 0);
      auVar111._4_4_ = -(uint)(auVar115._4_4_ < 0);
      auVar111._8_4_ = -(uint)(auVar115._8_4_ < 0);
      auVar111._12_4_ = -(uint)(auVar115._12_4_ < 0);
      auVar102 = packssdw(auVar111,auVar111);
      auVar102 = packsswb(auVar102,auVar102);
      auVar118 = auVar115 ^ auVar147;
      auVar134._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
      auVar134._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
      auVar134._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
      auVar134._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
      auVar118 = ~auVar134 & auVar148 | auVar115 & auVar134;
      sVar16 = auVar118._0_2_;
      cVar9 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      sVar17 = auVar118._2_2_;
      sVar121 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),cVar9);
      sVar18 = auVar118._4_2_;
      cVar10 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      sVar19 = auVar118._6_2_;
      uVar106 = CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19),
                         CONCAT12(cVar10,sVar121));
      sVar20 = auVar118._8_2_;
      cVar11 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      sVar21 = auVar118._10_2_;
      uVar122 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21),
                         CONCAT14(cVar11,uVar106));
      sVar22 = auVar118._12_2_;
      cVar12 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      sVar23 = auVar118._14_2_;
      uVar123 = CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23),
                         CONCAT16(cVar12,uVar122));
      cVar13 = (0 < sVar16) * (sVar16 < 0x100) * auVar118[0] - (0xff < sVar16);
      auVar126._0_10_ =
           CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar118[2] - (0xff < sVar17),
                    CONCAT18(cVar13,uVar123));
      cVar14 = (0 < sVar18) * (sVar18 < 0x100) * auVar118[4] - (0xff < sVar18);
      auVar126[10] = cVar14;
      auVar126[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar118[6] - (0xff < sVar19);
      cVar15 = (0 < sVar20) * (sVar20 < 0x100) * auVar118[8] - (0xff < sVar20);
      auVar129[0xc] = cVar15;
      auVar129._0_12_ = auVar126;
      auVar129[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21);
      cVar8 = (0 < sVar22) * (sVar22 < 0x100) * auVar118[0xc] - (0xff < sVar22);
      auVar135[0xe] = cVar8;
      auVar135._0_14_ = auVar129;
      auVar135[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar118[0xe] - (0xff < sVar23);
      sVar16 = (short)((uint)uVar106 >> 0x10);
      auVar112[1] = (0 < sVar16) * (sVar16 < 0x100) * cVar10 - (0xff < sVar16);
      auVar112[0] = (0 < sVar121) * (sVar121 < 0x100) * cVar9 - (0xff < sVar121);
      sVar17 = (short)((uint6)uVar122 >> 0x20);
      auVar112[2] = (0 < sVar17) * (sVar17 < 0x100) * cVar11 - (0xff < sVar17);
      sVar18 = (short)((ulong)uVar123 >> 0x30);
      auVar112[3] = (0 < sVar18) * (sVar18 < 0x100) * cVar12 - (0xff < sVar18);
      sVar19 = (short)((unkuint10)auVar126._0_10_ >> 0x40);
      auVar112[4] = (0 < sVar19) * (sVar19 < 0x100) * cVar13 - (0xff < sVar19);
      sVar20 = auVar126._10_2_;
      auVar112[5] = (0 < sVar20) * (sVar20 < 0x100) * cVar14 - (0xff < sVar20);
      sVar21 = auVar129._12_2_;
      auVar112[6] = (0 < sVar21) * (sVar21 < 0x100) * cVar15 - (0xff < sVar21);
      sVar22 = auVar135._14_2_;
      auVar112[7] = (0 < sVar22) * (sVar22 < 0x100) * cVar8 - (0xff < sVar22);
      auVar112[8] = (0 < sVar121) * (sVar121 < 0x100) * cVar9 - (0xff < sVar121);
      auVar112[9] = (0 < sVar16) * (sVar16 < 0x100) * cVar10 - (0xff < sVar16);
      auVar112[10] = (0 < sVar17) * (sVar17 < 0x100) * cVar11 - (0xff < sVar17);
      auVar112[0xb] = (0 < sVar18) * (sVar18 < 0x100) * cVar12 - (0xff < sVar18);
      auVar112[0xc] = (0 < sVar19) * (sVar19 < 0x100) * cVar13 - (0xff < sVar19);
      auVar112[0xd] = (0 < sVar20) * (sVar20 < 0x100) * cVar14 - (0xff < sVar20);
      auVar112[0xe] = (0 < sVar21) * (sVar21 < 0x100) * cVar15 - (0xff < sVar21);
      auVar112[0xf] = (0 < sVar22) * (sVar22 < 0x100) * cVar8 - (0xff < sVar22);
      auVar112 = ~auVar102 & auVar112;
      auVar116._0_8_ = auVar103._0_8_;
      auVar116._8_4_ = auVar103._4_4_;
      auVar116._12_4_ = auVar107._4_4_;
      uVar106 = auVar107._0_4_;
      auVar102._4_8_ = auVar116._8_8_;
      auVar102._0_4_ = uVar106;
      auVar102._12_4_ = 0;
      auVar102 = auVar102 << 0x20;
      auVar33[0xd] = 0;
      auVar33._0_13_ = auVar102._0_13_;
      auVar33[0xe] = auVar107[3];
      auVar38[0xc] = auVar107[2];
      auVar38._0_12_ = auVar102._0_12_;
      auVar38._13_2_ = auVar33._13_2_;
      uVar42 = auVar38._12_3_;
      auVar43[0xb] = 0;
      auVar43._0_11_ = auVar102._0_11_;
      auVar43._12_3_ = uVar42;
      auVar47[10] = auVar107[1];
      auVar47._0_10_ = auVar102._0_10_;
      auVar47._11_4_ = auVar43._11_4_;
      auVar51[9] = 0;
      auVar51._0_9_ = auVar102._0_9_;
      auVar51._10_5_ = auVar47._10_5_;
      auVar75[4] = auVar107[0];
      auVar75._0_4_ = uVar106;
      auVar75._5_6_ = auVar51._9_6_;
      auVar60._7_8_ = 0;
      auVar60._0_7_ = auVar75._4_7_;
      auVar76._1_8_ = SUB158(auVar60 << 0x40,7);
      auVar76[0] = auVar103[3];
      auVar76._9_6_ = 0;
      auVar61._1_10_ = SUB1510(auVar76 << 0x30,5);
      auVar61[0] = auVar103[2];
      auVar77._11_4_ = 0;
      auVar77._0_11_ = auVar61;
      auVar59._3_12_ = SUB1512(auVar77 << 0x20,3);
      auVar59[2] = auVar103[1];
      auVar59[1] = 0;
      auVar59[0] = auVar103[0];
      auVar117._0_4_ = auVar59._0_4_;
      auVar117._8_4_ = auVar75._4_4_;
      auVar119[3] = 0;
      auVar119._0_3_ = uVar42;
      auVar119._4_4_ = auVar61._0_4_;
      auVar119._8_4_ = auVar61._0_4_;
      auVar119._12_3_ = uVar42;
      auVar119[0xf] = 0;
      auVar102 = pshuflw(auVar119,auVar119,0xe2);
      auVar118 = pshufhw(auVar102,auVar102,0xed);
      auVar117._4_4_ = auVar117._8_4_;
      auVar117._12_4_ = auVar117._0_4_;
      auVar102 = pshuflw(auVar117,auVar117,0xe8);
      auVar102 = pshufhw(auVar102,auVar102,0xe7);
      sVar16 = auVar102._0_2_;
      sVar17 = auVar102._2_2_;
      sVar20 = auVar102._8_2_;
      sVar21 = auVar102._10_2_;
      sVar121 = auVar118._0_2_;
      sVar24 = auVar118._2_2_;
      sVar18 = auVar118._8_2_;
      local_a8[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar118[8] - (0xff < sVar18);
      sVar18 = auVar118._10_2_;
      local_a8[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar118[10] - (0xff < sVar18);
      uVar42 = CONCAT21((short)(((uint7)auVar112[3] << 0x30) >> 0x28),auVar112[2]);
      uVar78 = CONCAT12(auVar112[1],(ushort)auVar112[0]);
      auVar136 = ZEXT716(CONCAT34(uVar42,(uint)uVar42)) << 0x20;
      auVar136 = pshuflw(auVar136,auVar136,0x24);
      auVar137 = pshufhw(auVar136,auVar136,0xd4);
      auVar120._0_12_ = ZEXT312(uVar78);
      auVar120._12_3_ = uVar78;
      auVar120[0xf] = 0;
      auVar136 = pshuflw(auVar120,auVar120,0x84);
      auVar136 = pshufhw(auVar136,auVar136,0x74);
      sVar18 = auVar136._4_2_;
      sVar19 = auVar136._6_2_;
      sVar22 = auVar136._12_2_;
      sVar23 = auVar136._14_2_;
      sVar25 = auVar137._4_2_;
      sVar26 = auVar137._6_2_;
      sVar27 = auVar137._12_2_;
      bStack_9a = (0 < sVar27) * (sVar27 < 0x100) * auVar137[0xc] - (0xff < sVar27);
      sVar27 = auVar137._14_2_;
      cStack_99 = (0 < sVar27) * (sVar27 < 0x100) * auVar137[0xe] - (0xff < sVar27);
      local_a8[0] = (0 < sVar16) * (sVar16 < 0x100) * auVar102[0] - (0xff < sVar16);
      local_a8[1] = (0 < sVar17) * (sVar17 < 0x100) * auVar102[2] - (0xff < sVar17);
      local_a8[2] = (0 < sVar18) * (sVar18 < 0x100) * auVar136[4] - (0xff < sVar18);
      local_a8[3] = (0 < sVar19) * (sVar19 < 0x100) * auVar136[6] - (0xff < sVar19);
      local_a8[4] = (0 < sVar20) * (sVar20 < 0x100) * auVar102[8] - (0xff < sVar20);
      local_a8[5] = (0 < sVar21) * (sVar21 < 0x100) * auVar102[10] - (0xff < sVar21);
      local_a8[6] = (0 < sVar22) * (sVar22 < 0x100) * auVar136[0xc] - (0xff < sVar22);
      local_a8[7] = (0 < sVar23) * (sVar23 < 0x100) * auVar136[0xe] - (0xff < sVar23);
      local_a8[8] = (0 < sVar121) * (sVar121 < 0x100) * auVar118[0] - (0xff < sVar121);
      local_a8[9] = (0 < sVar24) * (sVar24 < 0x100) * auVar118[2] - (0xff < sVar24);
      local_a8[10] = (0 < sVar25) * (sVar25 < 0x100) * auVar137[4] - (0xff < sVar25);
      local_a8[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar137[6] - (0xff < sVar26);
      auVar28[0xd] = 0;
      auVar28._0_13_ = auVar103._0_13_;
      auVar28[0xe] = auVar103[7];
      auVar34[0xc] = auVar103[6];
      auVar34._0_12_ = auVar103._0_12_;
      auVar34._13_2_ = auVar28._13_2_;
      auVar39[0xb] = 0;
      auVar39._0_11_ = auVar103._0_11_;
      auVar39._12_3_ = auVar34._12_3_;
      auVar44[10] = auVar103[5];
      auVar44._0_10_ = auVar103._0_10_;
      auVar44._11_4_ = auVar39._11_4_;
      auVar48[9] = 0;
      auVar48._0_9_ = auVar103._0_9_;
      auVar48._10_5_ = auVar44._10_5_;
      auVar52[8] = auVar103[4];
      auVar52._0_8_ = auVar116._0_8_;
      auVar52._9_6_ = auVar48._9_6_;
      auVar62._7_8_ = 0;
      auVar62._0_7_ = auVar52._8_7_;
      Var63 = CONCAT81(SUB158(auVar62 << 0x40,7),auVar103[3]);
      auVar79._9_6_ = 0;
      auVar79._0_9_ = Var63;
      auVar64._1_10_ = SUB1510(auVar79 << 0x30,5);
      auVar64[0] = auVar103[2];
      auVar80._11_4_ = 0;
      auVar80._0_11_ = auVar64;
      auVar65._1_12_ = SUB1512(auVar80 << 0x20,3);
      auVar65[0] = auVar103[1];
      uVar101 = CONCAT11(0,auVar103[0]);
      auVar56._2_13_ = auVar65;
      auVar56._0_2_ = uVar101;
      uVar104 = (ushort)Var63;
      auVar35._10_2_ = 0;
      auVar35._0_10_ = auVar56._0_10_;
      auVar35._12_2_ = uVar104;
      uVar84 = CONCAT42(auVar35._10_4_,auVar64._0_2_);
      auVar66._6_8_ = 0;
      auVar66._0_6_ = uVar84;
      auVar29[0xd] = 0;
      auVar29._0_13_ = auVar107._0_13_;
      auVar29[0xe] = auVar107[7];
      auVar36[0xc] = auVar107[6];
      auVar36._0_12_ = auVar107._0_12_;
      auVar36._13_2_ = auVar29._13_2_;
      auVar40[0xb] = 0;
      auVar40._0_11_ = auVar107._0_11_;
      auVar40._12_3_ = auVar36._12_3_;
      auVar45[10] = auVar107[5];
      auVar45._0_10_ = auVar107._0_10_;
      auVar45._11_4_ = auVar40._11_4_;
      auVar49[9] = 0;
      auVar49._0_9_ = auVar107._0_9_;
      auVar49._10_5_ = auVar45._10_5_;
      auVar53[8] = auVar107[4];
      auVar53._0_8_ = auVar107._0_8_;
      auVar53._9_6_ = auVar49._9_6_;
      auVar67._7_8_ = 0;
      auVar67._0_7_ = auVar53._8_7_;
      Var63 = CONCAT81(SUB158(auVar67 << 0x40,7),auVar107[3]);
      auVar81._9_6_ = 0;
      auVar81._0_9_ = Var63;
      auVar55[4] = auVar107[2];
      auVar55._0_4_ = uVar106;
      auVar55._5_10_ = SUB1510(auVar81 << 0x30,5);
      auVar68._11_4_ = 0;
      auVar68._0_11_ = auVar55._4_11_;
      auVar69._1_12_ = SUB1512(auVar68 << 0x20,3);
      auVar69[0] = auVar107[1];
      uVar105 = CONCAT11(0,auVar107[0]);
      auVar57._2_13_ = auVar69;
      auVar57._0_2_ = uVar105;
      auVar30._10_2_ = 0;
      auVar30._0_10_ = auVar57._0_10_;
      auVar30._12_2_ = (short)Var63;
      uVar85 = CONCAT42(auVar30._10_4_,auVar55._4_2_);
      auVar70._6_8_ = 0;
      auVar70._0_6_ = uVar85;
      auVar31[0xd] = 0;
      auVar31._0_13_ = auVar112._0_13_;
      auVar31[0xe] = auVar112[7];
      auVar37[0xc] = auVar112[6];
      auVar37._0_12_ = auVar112._0_12_;
      auVar37._13_2_ = auVar31._13_2_;
      auVar41[0xb] = 0;
      auVar41._0_11_ = auVar112._0_11_;
      auVar41._12_3_ = auVar37._12_3_;
      auVar46[10] = auVar112[5];
      auVar46._0_10_ = auVar112._0_10_;
      auVar46._11_4_ = auVar41._11_4_;
      auVar50[9] = 0;
      auVar50._0_9_ = auVar112._0_9_;
      auVar50._10_5_ = auVar46._10_5_;
      auVar54[8] = auVar112[4];
      auVar54._0_8_ = auVar112._0_8_;
      auVar54._9_6_ = auVar50._9_6_;
      auVar71._7_8_ = 0;
      auVar71._0_7_ = auVar54._8_7_;
      Var63 = CONCAT81(SUB158(auVar71 << 0x40,7),auVar112[3]);
      auVar82._9_6_ = 0;
      auVar82._0_9_ = Var63;
      auVar72._1_10_ = SUB1510(auVar82 << 0x30,5);
      auVar72[0] = auVar112[2];
      auVar83._11_4_ = 0;
      auVar83._0_11_ = auVar72;
      auVar73._1_12_ = SUB1512(auVar83 << 0x20,3);
      auVar73[0] = auVar112[1];
      uVar108 = CONCAT11(0,auVar112[0]);
      auVar58._2_13_ = auVar73;
      auVar58._0_2_ = uVar108;
      auVar32._10_2_ = 0;
      auVar32._0_10_ = auVar58._0_10_;
      auVar32._12_2_ = (short)Var63;
      uVar86 = CONCAT42(auVar32._10_4_,auVar72._0_2_);
      auVar74._6_8_ = 0;
      auVar74._0_6_ = uVar86;
      uVar109 = (uint)uVar108 + (uint)uVar105 + (uint)uVar101;
      iVar113 = (int)CONCAT82(SUB148(auVar74 << 0x40,6),auVar73._0_2_) +
                (int)CONCAT82(SUB148(auVar70 << 0x40,6),auVar69._0_2_) +
                (int)CONCAT82(SUB148(auVar66 << 0x40,6),auVar65._0_2_);
      iVar91 = (int)uVar86 + (int)uVar85 + (int)uVar84;
      uVar114 = (auVar32._10_4_ >> 0x10) + (auVar30._10_4_ >> 0x10) + (uint)uVar104;
      local_84[0] = iVar113 + uVar109;
      local_84[1] = iVar113 + iVar91;
      local_84[2] = iVar91 + uVar114;
      pcVar6 = this->m_pParams->m_pSrc_pixels;
      uVar93 = this->m_pSorted_luma[uVar95 - 1];
      if (uVar93 * 2 < local_84[0]) {
        if ((uVar109 < uVar93 || uVar109 - uVar93 == 0) || (uVar109 - uVar93 < uVar88)) {
          memset((this->m_temp_selectors).m_p,0,__n);
          if (__n == 0) {
LAB_0018f438:
            uVar90 = 0;
            auVar147 = _DAT_001a7020;
            auVar148 = _DAT_001ae030;
            uVar97 = local_58;
            uVar138 = uStack_54;
            uVar139 = uStack_50;
            uVar140 = uStack_4c;
            uVar92 = local_68;
            uVar141 = uStack_64;
            uVar142 = uStack_60;
            uVar143 = uStack_5c;
            uVar89 = local_84[3];
            uVar144 = uStack_74;
            uVar145 = uStack_70;
            uVar146 = uStack_6c;
          }
          else {
            uVar88 = 0;
            uVar90 = 0;
            do {
              iVar113 = (uint)local_a8[0] - (uint)pcVar6[uVar88].field_0.field_0.r;
              iVar91 = (uint)local_a8[1] - (uint)pcVar6[uVar88].field_0.field_0.g;
              iVar94 = (uint)local_a8[2] - (uint)pcVar6[uVar88].field_0.field_0.b;
              uVar90 = uVar90 + (uint)(iVar94 * iVar94 + iVar91 * iVar91 + iVar113 * iVar113);
              uVar88 = uVar88 + 1;
              auVar147 = _DAT_001a7020;
              auVar148 = _DAT_001ae030;
              uVar97 = local_58;
              uVar138 = uStack_54;
              uVar139 = uStack_50;
              uVar140 = uStack_4c;
              uVar92 = local_68;
              uVar141 = uStack_64;
              uVar142 = uStack_60;
              uVar143 = uStack_5c;
              uVar89 = local_84[3];
              uVar144 = uStack_74;
              uVar145 = uStack_70;
              uVar146 = uStack_6c;
            } while (__n != uVar88);
          }
          goto LAB_0018f4e7;
        }
      }
      else {
        uVar93 = *this->m_pSorted_luma;
        if (uVar93 * 2 < local_84[2]) {
          if (__n == 0) {
            uVar90 = 0;
            uVar88 = 0;
LAB_0018f47c:
            if ((uint)uVar88 < uVar95) {
              uVar88 = uVar88 & 0xffffffff;
              do {
                uVar93 = this->m_pSorted_luma_indices[uVar88];
                (this->m_temp_selectors).m_p[uVar93] = '\x03';
                iVar91 = (uint)local_a8[0xc] - (uint)pcVar6[uVar93].field_0.field_0.r;
                iVar94 = (uint)local_a8[0xd] - (uint)pcVar6[uVar93].field_0.field_0.g;
                iVar113 = (uint)bStack_9a - (uint)pcVar6[uVar93].field_0.field_0.b;
                uVar90 = uVar90 + (uint)(iVar113 * iVar113 + iVar94 * iVar94 + iVar91 * iVar91);
                uVar88 = uVar88 + 1;
              } while (__n != uVar88);
            }
          }
          else {
            uVar88 = 0;
            uVar93 = 0;
            uVar90 = 0;
            do {
              while (uVar96 = (ulong)uVar93, local_84[uVar96] <= this->m_pSorted_luma[uVar88] * 2) {
                uVar93 = uVar93 + 1;
                if (2 < uVar93) goto LAB_0018f47c;
              }
              uVar109 = this->m_pSorted_luma_indices[uVar88];
              (this->m_temp_selectors).m_p[uVar109] = (uchar)uVar93;
              iVar91 = (uint)local_a8[uVar96 * 4] - (uint)pcVar6[uVar109].field_0.field_0.r;
              iVar94 = (uint)local_a8[uVar96 * 4 + 1] - (uint)pcVar6[uVar109].field_0.field_0.g;
              iVar113 = (uint)local_a8[uVar96 * 4 + 2] - (uint)pcVar6[uVar109].field_0.field_0.b;
              uVar90 = uVar90 + (uint)(iVar113 * iVar113 + iVar94 * iVar94 + iVar91 * iVar91);
              uVar88 = uVar88 + 1;
            } while (uVar88 != __n);
          }
        }
        else {
          if ((uVar114 <= uVar93 && uVar93 - uVar114 != 0) && (uVar88 <= uVar93 - uVar114))
          goto LAB_0018f54b;
          memset((this->m_temp_selectors).m_p,3,__n);
          if (__n == 0) goto LAB_0018f438;
          uVar88 = 0;
          uVar90 = 0;
          do {
            iVar113 = (uint)local_a8[0xc] - (uint)pcVar6[uVar88].field_0.field_0.r;
            iVar91 = (uint)local_a8[0xd] - (uint)pcVar6[uVar88].field_0.field_0.g;
            iVar94 = (uint)bStack_9a - (uint)pcVar6[uVar88].field_0.field_0.b;
            uVar90 = uVar90 + (uint)(iVar94 * iVar94 + iVar91 * iVar91 + iVar113 * iVar113);
            uVar88 = uVar88 + 1;
            auVar147 = _DAT_001a7020;
            auVar148 = _DAT_001ae030;
            uVar97 = local_58;
            uVar138 = uStack_54;
            uVar139 = uStack_50;
            uVar140 = uStack_4c;
            uVar92 = local_68;
            uVar141 = uStack_64;
            uVar142 = uStack_60;
            uVar143 = uStack_5c;
            uVar89 = local_84[3];
            uVar144 = uStack_74;
            uVar145 = uStack_70;
            uVar146 = uStack_6c;
          } while (__n != uVar88);
        }
LAB_0018f4e7:
        uVar88 = *local_90;
        if (uVar90 < *local_90) {
          trial_solution->m_error = uVar90;
          (trial_solution->m_coords).m_inten_table = (uint)lVar99;
          puVar7 = (trial_solution->m_selectors).m_p;
          (trial_solution->m_selectors).m_p = (this->m_temp_selectors).m_p;
          (this->m_temp_selectors).m_p = puVar7;
          uVar4 = (trial_solution->m_selectors).m_size;
          (trial_solution->m_selectors).m_size = (this->m_temp_selectors).m_size;
          (this->m_temp_selectors).m_size = uVar4;
          uVar4 = (trial_solution->m_selectors).m_capacity;
          (trial_solution->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
          (this->m_temp_selectors).m_capacity = uVar4;
          trial_solution->m_valid = true;
          uVar88 = uVar90;
          if (uVar90 == 0) {
            uVar88 = 0;
            break;
          }
        }
      }
LAB_0018f54b:
      bVar100 = lVar99 != 0;
      lVar99 = lVar99 + -1;
    } while (bVar100);
    ppVar87 = local_38;
    uVar3 = (local_40->m_unscaled_color).field_0.field_0.r;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.r = uVar3;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g =
         (local_40->m_unscaled_color).field_0.field_0.g;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b =
         (local_40->m_unscaled_color).field_0.field_0.b;
    (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a =
         (local_40->m_unscaled_color).field_0.field_0.a;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((local_38 != (potential_solution *)0x0) && (uVar88 < local_38->m_error)) {
      puVar1 = &local_38->m_error;
      (local_38->m_coords).m_unscaled_color.field_0.field_0.r = uVar3;
      (local_38->m_coords).m_unscaled_color.field_0.field_0.g =
           (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g;
      (local_38->m_coords).m_unscaled_color.field_0.field_0.b =
           (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b;
      (local_38->m_coords).m_unscaled_color.field_0.field_0.a =
           (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a;
      (local_38->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (local_38->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      if (local_38 != trial_solution) {
        uVar97 = (trial_solution->m_selectors).m_size;
        if ((local_38->m_selectors).m_capacity < uVar97) {
          this_00 = &local_38->m_selectors;
          if (this_00->m_p != (uchar *)0x0) {
            crnlib_free(this_00->m_p);
            this_00->m_p = (uchar *)0x0;
            this_00->m_size = 0;
            this_00->m_capacity = 0;
            uVar97 = (trial_solution->m_selectors).m_size;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar97,false,1,(object_mover)0x0,false);
        }
        else if ((local_38->m_selectors).m_size != 0) {
          (local_38->m_selectors).m_size = 0;
        }
        memcpy((ppVar87->m_selectors).m_p,(trial_solution->m_selectors).m_p,
               (ulong)(trial_solution->m_selectors).m_size);
        (ppVar87->m_selectors).m_size = (trial_solution->m_selectors).m_size;
      }
      ppVar87->m_valid = *(bool *)(local_90 + 1);
      *puVar1 = *local_90;
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
    {
        if (m_pParams->m_constrain_against_base_color5)
        {
            const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
            const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
            const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                trial_solution.m_valid = false;
                return false;
            }
        }

        const color_quad_u8 base_color(coords.get_scaled_color());

        const uint n = m_pParams->m_num_src_pixels;
        CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

        trial_solution.m_error = cUINT64_MAX;

        for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
        {
            const int* pInten_table = g_etc1_inten_tables[inten_table];

            uint block_inten[4];
            color_quad_u8 block_colors[4];
            for (uint s = 0; s < 4; s++)
            {
                const int yd = pInten_table[s];
                color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
                block_colors[s] = block_color;
                block_inten[s] = block_color.r + block_color.g + block_color.b;
            }

            // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
            // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
            // 0   1   2   3
            //   01  12  23
            const uint block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };

            uint64 total_error = 0;
            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
            {
                if (block_inten[0] > m_pSorted_luma[n - 1])
                {
                    const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 0, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[0], pSrc_pixels[c], false);
                }
            }
            else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
            {
                if (m_pSorted_luma[0] > block_inten[3])
                {
                    const uint min_error = m_pSorted_luma[0] - block_inten[3];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 3, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[c], false);
                }
            }
            else
            {
                uint cur_selector = 0, c;
                for (c = 0; c < n; c++)
                {
                    const uint y = m_pSorted_luma[c];
                    while ((y * 2) >= block_inten_midpoints[cur_selector])
                    {
                        if (++cur_selector > 2)
                        {
                            goto done;
                        }
                    }
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
                    total_error += color::elucidian_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
                }
            done:
                while (c < n)
                {
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = 3;
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
                    ++c;
                }
            }

            if (total_error < trial_solution.m_error)
            {
                trial_solution.m_error = total_error;
                trial_solution.m_coords.m_inten_table = inten_table;
                trial_solution.m_selectors.swap(m_temp_selectors);
                trial_solution.m_valid = true;
                if (!total_error)
                {
                    break;
                }
            }
        }
        trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
        trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

        bool success = false;
        if (pBest_solution)
        {
            if (trial_solution.m_error < pBest_solution->m_error)
            {
                *pBest_solution = trial_solution;
                success = true;
            }
        }

        return success;
    }